

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_loader_impl.c
# Opt level: O3

loader_handle
mock_loader_impl_load_from_memory(loader_impl impl,char *name,char *buffer,size_t size)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)malloc(8);
  if (puVar1 != (undefined8 *)0x0) {
    log_write_impl_va("metacall",0x169,"mock_loader_impl_load_from_memory",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                      ,0,"Mock module %s. loaded from memory",name);
    *puVar1 = 0;
  }
  return puVar1;
}

Assistant:

loader_handle mock_loader_impl_load_from_memory(loader_impl impl, const loader_name name, const char *buffer, size_t size)
{
	loader_impl_mock_handle handle = malloc(sizeof(struct loader_impl_mock_handle_type));

	(void)impl;
	(void)buffer;
	(void)size;

	if (handle != NULL)
	{
		log_write("metacall", LOG_LEVEL_DEBUG, "Mock module %s. loaded from memory", name);

		handle->handle_mock_data = NULL;

		return (loader_handle)handle;
	}

	return NULL;
}